

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

size_t gc_onestep(lua_State *L)

{
  MSize *pMVar1;
  cTValue *o;
  uint uVar2;
  MSize MVar3;
  uint32_t uVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  GCRef *pGVar9;
  char *pcVar10;
  size_t sVar11;
  size_t sVar12;
  uint uVar13;
  GCobj *pGVar14;
  ulong uVar15;
  int iVar16;
  undefined1 *puVar17;
  GCtab *t;
  global_State *g;
  ulong uVar19;
  int local_40;
  long lVar18;
  
  uVar2 = (L->glref).ptr32;
  g = (global_State *)(ulong)uVar2;
  switch((g->gc).state) {
  case '\0':
    (g->gc).gray = 0;
    (g->gc).grayagain = 0;
    (g->gc).weak.gcptr32 = 0;
    pGVar14 = (GCobj *)(ulong)(g->mainthref).gcptr32;
    if (((pGVar14->gch).marked & 3) != 0) {
      gc_mark(g,pGVar14);
    }
    pGVar14 = (GCobj *)(ulong)*(uint *)((ulong)(g->mainthref).gcptr32 + 0x2c);
    if (((pGVar14->gch).marked & 3) != 0) {
      gc_mark(g,pGVar14);
    }
    if (((g->registrytv).field_2.it + 0xd < 9) &&
       (pGVar14 = (GCobj *)(ulong)(g->registrytv).u32.lo, ((pGVar14->gch).marked & 3) != 0)) {
      gc_mark(g,pGVar14);
    }
    gc_mark_gcroot(g);
    (g->gc).state = '\x01';
    break;
  case '\x01':
    if ((g->gc).gray.gcptr32 != 0) {
      sVar11 = propagatemark(g);
      return sVar11;
    }
    (g->gc).state = '\x02';
    break;
  case '\x02':
    if ((g->jit_L).gcptr32 != 0) {
      return 0x7fffff00;
    }
    uVar7 = (g->uvhead).field_5.field_1.next.gcptr32;
    while (puVar17 = (undefined1 *)(ulong)uVar7, &g->uvhead != (GCupval *)puVar17) {
      if ((((puVar17[4] & 7) == 0) && (((uint *)(ulong)*(uint *)(puVar17 + 0x10))[1] + 0xd < 9)) &&
         (pGVar14 = (GCobj *)(ulong)*(uint *)(ulong)*(uint *)(puVar17 + 0x10),
         ((pGVar14->gch).marked & 3) != 0)) {
        gc_mark(g,pGVar14);
      }
      uVar7 = *(uint *)(puVar17 + 0xc);
    }
    while ((g->gc).gray.gcptr32 != 0) {
      propagatemark(g);
    }
    (g->gc).gray.gcptr32 = (g->gc).weak.gcptr32;
    (g->gc).weak.gcptr32 = 0;
    if ((L->marked & 3) != 0) {
      gc_mark(g,(GCobj *)L);
    }
    gc_traverse_trace(g,(GCtrace *)(g + 1));
    gc_mark_gcroot(g);
    while ((g->gc).gray.gcptr32 != 0) {
      propagatemark(g);
    }
    uVar4 = (g->gc).grayagain.gcptr32;
    (g->gc).gray.gcptr32 = uVar4;
    (g->gc).grayagain.gcptr32 = 0;
    while (uVar4 != 0) {
      propagatemark(g);
      uVar4 = (g->gc).gray.gcptr32;
    }
    sVar11 = lj_gc_separateudata(g,0);
    uVar7 = (g->gc).mmudata.gcptr32;
    pGVar14 = (GCobj *)(ulong)uVar7;
    if (pGVar14 != (GCobj *)0x0) {
      do {
        uVar5 = (pGVar14->gch).nextgc.gcptr32;
        pGVar14 = (GCobj *)(ulong)uVar5;
        (pGVar14->gch).marked = (g->gc).currentwhite & 3 | (pGVar14->gch).marked & 0xf8;
        gc_mark(g,pGVar14);
      } while (uVar5 != uVar7);
    }
    if ((g->gc).gray.gcptr32 == 0) {
      iVar16 = 0;
    }
    else {
      lVar18 = 0;
      do {
        sVar12 = propagatemark(g);
        lVar18 = lVar18 + sVar12;
        iVar16 = (int)lVar18;
      } while ((g->gc).gray.gcptr32 != 0);
    }
    uVar7 = (g->gc).weak.gcptr32;
    while (uVar7 != 0) {
      uVar19 = (ulong)uVar7;
      if (((*(byte *)(uVar19 + 4) & 0x10) != 0) &&
         (uVar7 = *(uint *)(uVar19 + 0x18), (ulong)uVar7 != 0)) {
        lVar18 = 0;
        do {
          uVar5 = *(uint *)(uVar19 + 8);
          iVar8 = gc_mayclear((cTValue *)((ulong)uVar5 + lVar18),1);
          if (iVar8 != 0) {
            *(undefined4 *)((ulong)uVar5 + 4 + lVar18) = 0xffffffff;
          }
          lVar18 = lVar18 + 8;
        } while ((ulong)uVar7 << 3 != lVar18);
      }
      uVar7 = *(uint *)(uVar19 + 0x1c);
      if (uVar7 != 0) {
        uVar5 = *(uint *)(uVar19 + 0x14);
        uVar15 = 0;
        do {
          if (*(int *)((ulong)uVar5 + 4 + uVar15 * 0x18) != -1) {
            o = (cTValue *)((ulong)uVar5 + uVar15 * 0x18);
            iVar8 = gc_mayclear(o + 1,0);
            if ((iVar8 != 0) || (iVar8 = gc_mayclear(o,1), iVar8 != 0)) {
              (o->field_2).it = 0xffffffff;
            }
          }
          uVar13 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar13;
        } while (uVar13 <= uVar7);
      }
      uVar7 = *(uint *)(uVar19 + 0xc);
    }
    local_40 = (int)sVar11;
    bVar6 = (g->gc).currentwhite ^ 3;
    (g->gc).currentwhite = bVar6;
    (g->strempty).marked = bVar6;
    (g->gc).sweep.ptr32 = uVar2 + 0x30;
    (g->gc).estimate = (g->gc).total - (iVar16 + local_40);
    (g->gc).state = '\x03';
    (g->gc).sweepstr = 0;
    break;
  case '\x03':
    MVar3 = (g->gc).total;
    uVar2 = (g->gc).sweepstr;
    (g->gc).sweepstr = uVar2 + 1;
    gc_sweep(g,g->strhash + uVar2,0x7fffff00);
    if (g->strmask < (g->gc).sweepstr) {
      (g->gc).state = '\x04';
    }
    pMVar1 = &(g->gc).estimate;
    *pMVar1 = *pMVar1 + ((g->gc).total - MVar3);
    return 10;
  case '\x04':
    MVar3 = (g->gc).total;
    pGVar9 = gc_sweep(g,(GCRef *)(ulong)(g->gc).sweep.ptr32,0x28);
    (g->gc).sweep.ptr32 = (uint32_t)pGVar9;
    pMVar1 = &(g->gc).estimate;
    *pMVar1 = *pMVar1 + ((g->gc).total - MVar3);
    if (*(int *)((ulong)pGVar9 & 0xffffffff) != 0) {
      return 400;
    }
    uVar2 = g->strmask;
    if ((0x1ff < uVar2) && (g->strnum <= uVar2 >> 2)) {
      lj_str_resize(L,uVar2 >> 1);
    }
    uVar2 = (g->tmpbuf).sz;
    if (0x40 < uVar2) {
      pcVar10 = (char *)lj_mem_realloc(L,(g->tmpbuf).buf,uVar2,uVar2 >> 1);
      (g->tmpbuf).buf = pcVar10;
      pMVar1 = &(g->tmpbuf).sz;
      *pMVar1 = *pMVar1 >> 1;
    }
    if ((g->gc).mmudata.gcptr32 != 0) {
      (g->gc).state = '\x05';
      (g->gc).nocdatafin = '\x01';
      return 400;
    }
    (g->gc).state = '\0';
    (g->gc).debt = 0;
    return 400;
  case '\x05':
    if ((g->gc).mmudata.gcptr32 != 0) {
      if ((g->jit_L).gcptr32 != 0) {
        return 0x7fffff00;
      }
      gc_finalize(L);
      uVar2 = (g->gc).estimate;
      if (uVar2 < 0x65) {
        return 100;
      }
      (g->gc).estimate = uVar2 - 100;
      return 100;
    }
    if ((g->gc).nocdatafin == '\0') {
      rehashtab(L,*(GCtab **)((ulong)(g->ctype_state).ptr32 + 0x20),&(g->nilnode).val);
    }
    (g->gc).state = '\0';
    (g->gc).debt = 0;
  }
  return 0;
}

Assistant:

static size_t gc_onestep(lua_State *L)
{
  global_State *g = G(L);
  switch (g->gc.state) {
  case GCSpause:
    gc_mark_start(g);  /* Start a new GC cycle by marking all GC roots. */
    return 0;
  case GCSpropagate:
    if (gcref(g->gc.gray) != NULL)
      return propagatemark(g);  /* Propagate one gray object. */
    g->gc.state = GCSatomic;  /* End of mark phase. */
    return 0;
  case GCSatomic:
    if (gcref(g->jit_L))  /* Don't run atomic phase on trace. */
      return LJ_MAX_MEM;
    atomic(g, L);
    g->gc.state = GCSsweepstring;  /* Start of sweep phase. */
    g->gc.sweepstr = 0;
    return 0;
  case GCSsweepstring: {
    MSize old = g->gc.total;
    gc_fullsweep(g, &g->strhash[g->gc.sweepstr++]);  /* Sweep one chain. */
    if (g->gc.sweepstr > g->strmask)
      g->gc.state = GCSsweep;  /* All string hash chains sweeped. */
    lua_assert(old >= g->gc.total);
    g->gc.estimate -= old - g->gc.total;
    return GCSWEEPCOST;
    }
  case GCSsweep: {
    MSize old = g->gc.total;
    setmref(g->gc.sweep, gc_sweep(g, mref(g->gc.sweep, GCRef), GCSWEEPMAX));
    lua_assert(old >= g->gc.total);
    g->gc.estimate -= old - g->gc.total;
    if (gcref(*mref(g->gc.sweep, GCRef)) == NULL) {
      gc_shrink(g, L);
      if (gcref(g->gc.mmudata)) {  /* Need any finalizations? */
	g->gc.state = GCSfinalize;
#if LJ_HASFFI
	g->gc.nocdatafin = 1;
#endif
      } else {  /* Otherwise skip this phase to help the JIT. */
	g->gc.state = GCSpause;  /* End of GC cycle. */
	g->gc.debt = 0;
      }
    }
    return GCSWEEPMAX*GCSWEEPCOST;
    }
  case GCSfinalize:
    if (gcref(g->gc.mmudata) != NULL) {
      if (gcref(g->jit_L))  /* Don't call finalizers on trace. */
	return LJ_MAX_MEM;
      gc_finalize(L);  /* Finalize one userdata object. */
      if (g->gc.estimate > GCFINALIZECOST)
	g->gc.estimate -= GCFINALIZECOST;
      return GCFINALIZECOST;
    }
#if LJ_HASFFI
    if (!g->gc.nocdatafin) lj_tab_rehash(L, ctype_ctsG(g)->finalizer);
#endif
    g->gc.state = GCSpause;  /* End of GC cycle. */
    g->gc.debt = 0;
    return 0;
  default:
    lua_assert(0);
    return 0;
  }
}